

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O0

int deal_ws_request(int new_fd,sockaddr_in *client_addr,int shm_id,int i,int write_fd)

{
  int iVar1;
  ws_request *req_00;
  char *__src;
  ssize_t sVar2;
  int maxfd;
  int resel;
  ws_request *req;
  timeval timeout;
  fd_set *__arr;
  undefined1 local_8d0 [4];
  uint __i;
  fd_set read_set;
  int file_byte;
  int read_byte;
  char send_buf [1025];
  char local_438 [8];
  char recv_buf [1025];
  int read_fd;
  PIPE *pipes;
  int write_fd_local;
  int i_local;
  int shm_id_local;
  sockaddr_in *client_addr_local;
  int new_fd_local;
  
  printf("%d",(ulong)(uint)shm_id);
  register0x00000000 = shmat(shm_id,(void *)0x0,0);
  if (register0x00000000 == (void *)0xffffffffffffffff) {
    printf("Cannot link sharing memory to this process!(Game server)\n");
  }
  else {
    recv_buf._1020_4_ = *(undefined4 *)((long)register0x00000000 + (long)i * 0xec);
    memset(local_438,0,0x401);
    memset(&file_byte,0,0x401);
    read_set.__fds_bits[0xf]._4_4_ = 0;
    read_set.__fds_bits[0xf]._0_4_ = 0;
    timeout.tv_usec = (__suseconds_t)local_8d0;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(timeout.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
    }
    read_set.__fds_bits[(long)(new_fd / 0x40) + -1] =
         1L << ((byte)((long)new_fd % 0x40) & 0x3f) |
         read_set.__fds_bits[(long)(new_fd / 0x40) + -1];
    req = (ws_request *)0xa;
    timeout.tv_sec = 0;
    req_00 = (ws_request *)malloc(0x10f8);
    __src = inet_ntoa((in_addr)(client_addr->sin_addr).s_addr);
    strcpy(req_00->address,__src);
    req_00->port = (uint)client_addr->sin_port;
    req_00->client_socket = new_fd;
    req_00->method_right_state = false;
    while (iVar1 = select(new_fd + 1,(fd_set *)local_8d0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&req
                         ), iVar1 != -1) {
      if (iVar1 == 0) {
        printf("Listen time out!\n");
        return 1;
      }
      if ((read_set.__fds_bits[(long)(new_fd / 0x40) + -1] &
          1L << ((byte)((long)new_fd % 0x40) & 0x3f)) != 0) {
        sVar2 = recv(new_fd,local_438,0x4000,0);
        read_set.__fds_bits[0xf]._4_4_ = (int)sVar2;
        if (read_set.__fds_bits[0xf]._4_4_ == 0) {
          return 0;
        }
        if (read_set.__fds_bits[0xf]._4_4_ < 0) {
          perror("Read request failure!");
          return -1;
        }
        printf("\n%s\n",local_438);
        iVar1 = is_ws_request(local_438,req_00);
        if (iVar1 == -1) {
          printf("WebSocket request is illegal!\n");
          return -1;
        }
        iVar1 = do_ws_response(req_00);
        if (iVar1 == -1) {
          printf("Send WebSocket response failure!\n");
          return -1;
        }
        iVar1 = analyGame(req_00->uri,(char *)((long)stack0xffffffffffffffd0 + (long)i * 0xec + 9),
                          (int *)((long)stack0xffffffffffffffd0 + (long)i * 0xec + 0x1c));
        if (iVar1 == -1) {
          printf("Game name analysis error\n");
          return -1;
        }
        iVar1 = webSocket_session(new_fd,write_fd,recv_buf._1020_4_,i);
        if (iVar1 != -1) {
          if (iVar1 == 1) {
            printf("WebSocket session is close!\n");
            return 1;
          }
          printf("Unknow error!\n");
          return -1;
        }
        printf("Pipe is broken\n");
        return -1;
      }
      perror("FD set happen crash!");
    }
    perror("Cannot select read_fd!");
  }
  return -1;
}

Assistant:

int deal_ws_request(int new_fd, struct sockaddr_in *client_addr, int shm_id, int i, int write_fd){
    struct PIPE *pipes;
    printf("%d", shm_id);
    pipes = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(pipes == -1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }

    int read_fd = pipes[i].pipe[0];

    char recv_buf[HEAD_MAX_SIZE + 1] = "";
    char send_buf[HEAD_MAX_SIZE + 1] = "";

    int read_byte = 0;
    int file_byte = 0;


    fd_set read_set;
    FD_ZERO(&read_set);
    FD_SET(new_fd, &read_set);

    struct timeval timeout;
    timeout.tv_sec = TIME_OUT_SEC;
    timeout.tv_usec = TIME_OUT_USEC;

    struct ws_request *req
            = (struct ws_request *)malloc(sizeof(struct ws_request));
    strcpy(req->address, inet_ntoa(client_addr->sin_addr));
    req->port = client_addr->sin_port;
    req->client_socket = new_fd;
    req->method_right_state = false;

    int resel = 0;
    int maxfd = new_fd+1;

    while(true){
        resel = select(maxfd, &read_set, NULL, NULL, &timeout);
        switch (resel) {
            case -1:
                perror("Cannot select read_fd!");
                return -1;
            case 0:
                printf("Listen time out!\n");
                return 1;
            default:
                if(FD_ISSET(new_fd, &read_set)){
                    read_byte = (int)recv(new_fd, recv_buf, 16384, 0);
                    if(read_byte == 0){
                        return 0;     //connect interrupt!
                    } else if(read_byte < 0) {
                        perror("Read request failure!");
                        return -1;
                    } else {
                        printf("\n%s\n",recv_buf);
                        if(is_ws_request(recv_buf,req) == -1){
                            printf("WebSocket request is illegal!\n");
                            return -1;
                        }
                        if(do_ws_response(req) == -1){
                            printf("Send WebSocket response failure!\n");
                            return -1;
                        }
                        if(analyGame(req->uri, pipes[i].name, &(pipes[i].level))  == -1){
                            printf("Game name analysis error\n");
                            return -1;
                        }
                        switch (webSocket_session(new_fd, write_fd, read_fd, i)){
                            case 1:
                                printf("WebSocket session is close!\n");
                                return 1;
                            case -1:
                                printf("Pipe is broken\n");
                                return -1;
                            default:
                                printf("Unknow error!\n");
                                return -1;
                        }
                        return 1;
                    }
                } else {
                    perror("FD set happen crash!");
                    continue;
                }
        }
    }
}